

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O1

string * __thiscall Player::GetCommData_abi_cxx11_(string *__return_storage_ptr__,Player *this)

{
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str((string *)&this->field_0x170);
  return __return_storage_ptr__;
}

Assistant:

std::string Player::GetCommData() {
    std::string data = m_send_queue.str();
    m_send_queue.str(std::string());
    return data;
}